

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnTable(SharedValidator *this,Location *loc,Type elem_type,Limits *limits)

{
  pointer *ppTVar1;
  iterator __position;
  Result RVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  TableType local_50;
  
  if (((this->tables_).
       super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       (this->tables_).
       super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
       ._M_impl.super__Vector_impl_data._M_start) ||
     ((this->options_).features.reference_types_enabled_ != false)) {
    bVar5 = false;
  }
  else {
    RVar2 = PrintError(this,loc,"only one table allowed");
    bVar5 = RVar2.enum_ == Error;
  }
  RVar2 = CheckLimits(this,loc,limits,0xffffffff,"elems");
  bVar4 = RVar2.enum_ == Error | bVar5;
  if (limits->is_shared == true) {
    RVar2 = PrintError(this,loc,"tables may not be shared");
    bVar4 = bVar4 | RVar2.enum_ == Error;
  }
  if ((elem_type.enum_ != FuncRef) && ((this->options_).features.reference_types_enabled_ == false))
  {
    RVar2 = PrintError(this,loc,"tables must have funcref type");
    bVar4 = bVar4 | RVar2.enum_ == Error;
  }
  uVar3 = elem_type.enum_ + 0x17;
  if ((7 < uVar3) || ((0xc5U >> (uVar3 & 0x1f) & 1) == 0)) {
    RVar2 = PrintError(this,loc,"tables must have reference types");
    bVar4 = bVar4 | RVar2.enum_ == Error;
  }
  local_50.limits.has_max = limits->has_max;
  local_50.limits.is_shared = limits->is_shared;
  local_50.limits.is_64 = limits->is_64;
  local_50.limits._19_5_ = *(undefined5 *)&limits->field_0x13;
  local_50.limits.initial = limits->initial;
  local_50.limits.max = limits->max;
  __position._M_current =
       (this->tables_).
       super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->tables_).
      super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_50.element = elem_type;
    std::vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
    ::_M_realloc_insert<wabt::SharedValidator::TableType>(&this->tables_,__position,&local_50);
  }
  else {
    ((__position._M_current)->limits).max = local_50.limits.max;
    ((__position._M_current)->limits).has_max = local_50.limits.has_max;
    ((__position._M_current)->limits).is_shared = local_50.limits.is_shared;
    ((__position._M_current)->limits).is_64 = local_50.limits.is_64;
    *(undefined5 *)&((__position._M_current)->limits).field_0x13 = local_50.limits._19_5_;
    (__position._M_current)->element = elem_type;
    ((__position._M_current)->limits).initial = local_50.limits.initial;
    ppTVar1 = &(this->tables_).
               super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar4;
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::OnTable(const Location& loc,
                                Type elem_type,
                                const Limits& limits) {
  Result result = Result::Ok;
  if (tables_.size() > 0 && !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "only one table allowed");
  }
  result |= CheckLimits(loc, limits, UINT32_MAX, "elems");

  if (limits.is_shared) {
    result |= PrintError(loc, "tables may not be shared");
  }
  if (elem_type != Type::FuncRef &&
      !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "tables must have funcref type");
  }
  if (!elem_type.IsRef()) {
    result |= PrintError(loc, "tables must have reference types");
  }

  tables_.push_back(TableType{elem_type, limits});
  return result;
}